

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<(ChArchiveOut *this,ChNameValue<double[3]> *bVal)

{
  ChNameValue<double[3]> local_30;
  ChNameValue<double[3]> *local_18;
  ChNameValue<double[3]> *bVal_local;
  ChArchiveOut *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<double[3]> *)this;
  ChNameValue<double[3]>::ChNameValue(&local_30,bVal);
  out<double,3ul>(this,&local_30);
  ChNameValue<double[3]>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }